

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl.c
# Opt level: O2

yajl_status yajl_complete_parse(yajl_handle hand)

{
  yajl_status yVar1;
  yajl_lexer pyVar2;
  
  if (hand->lexer == (yajl_lexer)0x0) {
    pyVar2 = yajl_lex_alloc(&hand->alloc,hand->flags & 1,(uint)((hand->flags & 2) == 0));
    hand->lexer = pyVar2;
  }
  yVar1 = yajl_do_finish(hand);
  return yVar1;
}

Assistant:

yajl_status
yajl_complete_parse(yajl_handle hand)
{
    /* The lexer is lazy allocated in the first call to parse.  if parse is
     * never called, then no data was provided to parse at all.  This is a
     * "premature EOF" error unless yajl_allow_partial_values is specified.
     * allocating the lexer now is the simplest possible way to handle this
     * case while preserving all the other semantics of the parser
     * (multiple values, partial values, etc). */
    if (hand->lexer == NULL) {
        hand->lexer = yajl_lex_alloc(&(hand->alloc),
                                     hand->flags & yajl_allow_comments,
                                     !(hand->flags & yajl_dont_validate_strings));
    }

    return yajl_do_finish(hand);
}